

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void end_pass(stagewise_poly *poly)

{
  vw *all;
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (poly->batch_sz != 0) {
    return;
  }
  all = poly->all;
  if ((all->all_reduce == (AllReduce *)0x0) || (poly->numpasses < 2)) {
    uVar4 = poly->sum_sparsity - poly->sum_sparsity_sync;
    uVar1 = poly->sum_input_sparsity - poly->sum_input_sparsity_sync;
    uVar3 = poly->num_examples - poly->num_examples_sync;
    if (all->all_reduce != (AllReduce *)0x0) {
      all_reduce<unsigned_char,_&reduce_min_max>
                (all,poly->depthsbits,2L << ((byte)all->num_bits & 0x3f));
      fVar5 = accumulate_scalar(all,(float)uVar1);
      fVar6 = accumulate_scalar(all,(float)uVar4);
      uVar1 = (long)fVar5 | (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f;
      uVar4 = (long)fVar6 | (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f;
      fVar5 = accumulate_scalar(all,(float)uVar3);
      uVar3 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
    }
    uVar2 = uVar1 + poly->sum_input_sparsity_sync;
    poly->sum_input_sparsity_sync = uVar2;
    poly->sum_input_sparsity = uVar2;
    uVar2 = uVar4 + poly->sum_sparsity_sync;
    poly->sum_sparsity_sync = uVar2;
    poly->sum_sparsity = uVar2;
    uVar2 = uVar3 + poly->num_examples_sync;
    poly->num_examples_sync = uVar2;
    poly->num_examples = uVar2;
    if (poly->numpasses != poly->all->numpasses) {
      poly->update_support = true;
      poly->numpasses = poly->numpasses + 1;
    }
  }
  return;
}

Assistant:

void end_pass(stagewise_poly &poly)
{
  if (!!poly.batch_sz || (poly.all->all_reduce != nullptr && poly.numpasses > 1))
    return;

  uint64_t sum_sparsity_inc = poly.sum_sparsity - poly.sum_sparsity_sync;
  uint64_t sum_input_sparsity_inc = poly.sum_input_sparsity - poly.sum_input_sparsity_sync;
  uint64_t num_examples_inc = poly.num_examples - poly.num_examples_sync;

#ifdef DEBUG
  cout << "Sanity before allreduce\n";
  sanity_check_state(poly);
#endif  // DEBUG

  vw &all = *poly.all;
  if (all.all_reduce != nullptr)
  {
    /*
     * The following is inconsistent with the transplant code in
     * synthetic_create_rec(), which clears parent bits on depth mismatches.
     * But it's unclear what the right behavior is in general for either
     * case...
     */
    all_reduce<uint8_t, reduce_min_max>(all, poly.depthsbits, depthsbits_sizeof(poly));

    sum_input_sparsity_inc = (uint64_t)accumulate_scalar(all, (float)sum_input_sparsity_inc);
    sum_sparsity_inc = (uint64_t)accumulate_scalar(all, (float)sum_sparsity_inc);
    num_examples_inc = (uint64_t)accumulate_scalar(all, (float)num_examples_inc);
  }

  poly.sum_input_sparsity_sync = poly.sum_input_sparsity_sync + sum_input_sparsity_inc;
  poly.sum_input_sparsity = poly.sum_input_sparsity_sync;
  poly.sum_sparsity_sync = poly.sum_sparsity_sync + sum_sparsity_inc;
  poly.sum_sparsity = poly.sum_sparsity_sync;
  poly.num_examples_sync = poly.num_examples_sync + num_examples_inc;
  poly.num_examples = poly.num_examples_sync;

#ifdef DEBUG
  cout << "Sanity after allreduce\n";
  sanity_check_state(poly);
#endif  // DEBUG

  if (poly.numpasses != poly.all->numpasses)
  {
    poly.update_support = true;
    poly.numpasses++;
  }
}